

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

void __thiscall icu_63::NFRuleSet::setNonNumericalRule(NFRuleSet *this,NFRule *rule)

{
  NFRule *pNVar1;
  int64_t iVar2;
  NFRule *p;
  int64_t baseValue;
  NFRule *rule_local;
  NFRuleSet *this_local;
  
  p = rule;
  iVar2 = NFRule::getBaseValue(rule);
  if (iVar2 == -1) {
    pNVar1 = this->nonNumericalRules[0];
    if (pNVar1 != (NFRule *)0x0) {
      NFRule::~NFRule(pNVar1);
      UMemory::operator_delete((UMemory *)pNVar1,p);
    }
    this->nonNumericalRules[0] = rule;
  }
  else if (iVar2 == -2) {
    setBestFractionRule(this,1,rule,'\x01');
  }
  else if (iVar2 == -3) {
    setBestFractionRule(this,2,rule,'\x01');
  }
  else if (iVar2 == -4) {
    setBestFractionRule(this,3,rule,'\x01');
  }
  else if (iVar2 == -5) {
    pNVar1 = this->nonNumericalRules[4];
    if (pNVar1 != (NFRule *)0x0) {
      NFRule::~NFRule(pNVar1);
      UMemory::operator_delete((UMemory *)pNVar1,p);
    }
    this->nonNumericalRules[4] = rule;
  }
  else if (iVar2 == -6) {
    pNVar1 = this->nonNumericalRules[5];
    if (pNVar1 != (NFRule *)0x0) {
      NFRule::~NFRule(pNVar1);
      UMemory::operator_delete((UMemory *)pNVar1,p);
    }
    this->nonNumericalRules[5] = rule;
  }
  return;
}

Assistant:

void NFRuleSet::setNonNumericalRule(NFRule *rule) {
    int64_t baseValue = rule->getBaseValue();
    if (baseValue == NFRule::kNegativeNumberRule) {
        delete nonNumericalRules[NEGATIVE_RULE_INDEX];
        nonNumericalRules[NEGATIVE_RULE_INDEX] = rule;
    }
    else if (baseValue == NFRule::kImproperFractionRule) {
        setBestFractionRule(IMPROPER_FRACTION_RULE_INDEX, rule, TRUE);
    }
    else if (baseValue == NFRule::kProperFractionRule) {
        setBestFractionRule(PROPER_FRACTION_RULE_INDEX, rule, TRUE);
    }
    else if (baseValue == NFRule::kMasterRule) {
        setBestFractionRule(MASTER_RULE_INDEX, rule, TRUE);
    }
    else if (baseValue == NFRule::kInfinityRule) {
        delete nonNumericalRules[INFINITY_RULE_INDEX];
        nonNumericalRules[INFINITY_RULE_INDEX] = rule;
    }
    else if (baseValue == NFRule::kNaNRule) {
        delete nonNumericalRules[NAN_RULE_INDEX];
        nonNumericalRules[NAN_RULE_INDEX] = rule;
    }
}